

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello_world.cpp
# Opt level: O0

void __thiscall hello::hello_world(hello *this)

{
  bool bVar1;
  time_t tVar2;
  cookie *pcVar3;
  ostream *poVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  pointer ppVar6;
  basic_format<char> *this_00;
  message_type *trans;
  int i;
  const_iterator p;
  string t3;
  string t2;
  string t1;
  ostringstream ss;
  undefined4 in_stack_fffffffffffff128;
  int in_stack_fffffffffffff12c;
  basic_format<char> *in_stack_fffffffffffff130;
  escape *in_stack_fffffffffffff138;
  basic_format<char> *in_stack_fffffffffffff140;
  basic_message<char> *in_stack_fffffffffffff148;
  streamable *in_stack_fffffffffffff150;
  string_type *in_stack_fffffffffffff168;
  basic_format<char> *in_stack_fffffffffffff170;
  int local_ac4;
  streamable local_a40;
  escape local_a20 [40];
  time_t local_9f8;
  streamable local_9f0;
  date local_9d0 [72];
  _Self local_988;
  _Base_ptr local_980;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>
  local_978;
  locale local_970 [8];
  string local_968 [32];
  time_t local_948;
  streamable local_940;
  escape local_920 [47];
  allocator local_8f1;
  string local_8f0 [360];
  time_t local_788;
  allocator local_779;
  string local_778 [360];
  streamable local_610;
  base64_urlencode local_5f0 [40];
  streamable local_5c8;
  urlencode local_5a8 [40];
  streamable local_580;
  escape local_560 [40];
  streamable local_538;
  to_title local_518 [40];
  streamable local_4f0;
  to_lower local_4d0 [40];
  streamable local_4a8;
  to_upper local_488 [40];
  time_t local_460;
  streamable local_458;
  datetime local_438 [72];
  time_t local_3f0;
  streamable local_3e8;
  time local_3c8 [72];
  time_t local_380;
  streamable local_378;
  date local_358 [79];
  allocator local_309;
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [32];
  string local_298 [39];
  allocator local_271;
  string local_270 [32];
  cookie local_250 [208];
  ostringstream local_180 [384];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  tVar2 = time((time_t *)0x0);
  std::ostream::operator<<(local_180,tVar2);
  pcVar3 = (cookie *)cppcms::application::response();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"test",&local_271);
  std::__cxx11::ostringstream::str();
  cppcms::http::cookie::cookie(local_250,local_270,local_298);
  cppcms::http::response::set_cookie(pcVar3);
  cppcms::http::cookie::~cookie(local_250);
  std::__cxx11::string::~string(local_298);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  cppcms::application::response();
  poVar4 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar4,"<html><body>\n<h1>Hello World!</h1>\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"text",&local_2b9);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e0,"text text",&local_2e1);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_308,"<text>",&local_309);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  cppcms::application::response();
  cppcms::http::response::out();
  local_380 = time((time_t *)0x0);
  cppcms::filters::streamable::streamable<long>
            (in_stack_fffffffffffff150,(long *)in_stack_fffffffffffff148);
  cppcms::filters::date::date(local_358,&local_378);
  poVar4 = cppcms::filters::operator<<
                     ((ostream *)in_stack_fffffffffffff130,
                      (date *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
  std::operator<<(poVar4,"<br>\n");
  cppcms::filters::date::~date(local_358);
  cppcms::filters::streamable::~streamable(&local_378);
  cppcms::application::response();
  cppcms::http::response::out();
  local_3f0 = time((time_t *)0x0);
  cppcms::filters::streamable::streamable<long>
            (in_stack_fffffffffffff150,(long *)in_stack_fffffffffffff148);
  cppcms::filters::time::time(local_3c8,&local_3e8);
  poVar4 = cppcms::filters::operator<<
                     ((ostream *)in_stack_fffffffffffff130,
                      (time *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
  std::operator<<(poVar4,"<br>\n");
  cppcms::filters::time::~time(local_3c8);
  cppcms::filters::streamable::~streamable(&local_3e8);
  cppcms::application::response();
  cppcms::http::response::out();
  local_460 = time((time_t *)0x0);
  cppcms::filters::streamable::streamable<long>
            (in_stack_fffffffffffff150,(long *)in_stack_fffffffffffff148);
  cppcms::filters::datetime::datetime(local_438,&local_458);
  poVar4 = cppcms::filters::operator<<
                     ((ostream *)in_stack_fffffffffffff130,
                      (datetime *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
  std::operator<<(poVar4,"<br>\n");
  cppcms::filters::datetime::~datetime(local_438);
  cppcms::filters::streamable::~streamable(&local_458);
  cppcms::application::response();
  cppcms::http::response::out();
  cppcms::filters::streamable::streamable<std::__cxx11::string>(&local_4a8,local_2b8);
  cppcms::filters::to_upper::to_upper(local_488,&local_4a8);
  poVar4 = cppcms::filters::operator<<
                     ((ostream *)in_stack_fffffffffffff130,
                      (to_upper *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
  std::operator<<(poVar4,"<br>\n");
  cppcms::filters::to_upper::~to_upper(local_488);
  cppcms::filters::streamable::~streamable(&local_4a8);
  cppcms::application::response();
  cppcms::http::response::out();
  cppcms::filters::streamable::streamable<std::__cxx11::string>(&local_4f0,local_2b8);
  cppcms::filters::to_lower::to_lower(local_4d0,&local_4f0);
  poVar4 = cppcms::filters::operator<<
                     ((ostream *)in_stack_fffffffffffff130,
                      (to_lower *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
  std::operator<<(poVar4,"<br>\n");
  cppcms::filters::to_lower::~to_lower(local_4d0);
  cppcms::filters::streamable::~streamable(&local_4f0);
  cppcms::application::response();
  cppcms::http::response::out();
  cppcms::filters::streamable::streamable<std::__cxx11::string>(&local_538,local_2b8);
  cppcms::filters::to_title::to_title(local_518,&local_538);
  poVar4 = cppcms::filters::operator<<
                     ((ostream *)in_stack_fffffffffffff130,
                      (to_title *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
  std::operator<<(poVar4,"<br>\n");
  cppcms::filters::to_title::~to_title(local_518);
  cppcms::filters::streamable::~streamable(&local_538);
  cppcms::application::response();
  cppcms::http::response::out();
  cppcms::filters::streamable::streamable<std::__cxx11::string>(&local_580,local_308);
  cppcms::filters::escape::escape(local_560,&local_580);
  poVar4 = cppcms::filters::operator<<
                     ((ostream *)in_stack_fffffffffffff130,
                      (escape *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
  std::operator<<(poVar4,"<br>\n");
  cppcms::filters::escape::~escape(local_560);
  cppcms::filters::streamable::~streamable(&local_580);
  cppcms::application::response();
  cppcms::http::response::out();
  cppcms::filters::streamable::streamable<std::__cxx11::string>(&local_5c8,local_2e0);
  cppcms::filters::urlencode::urlencode(local_5a8,&local_5c8);
  poVar4 = cppcms::filters::operator<<
                     ((ostream *)in_stack_fffffffffffff130,
                      (urlencode *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
  std::operator<<(poVar4,"<br>\n");
  cppcms::filters::urlencode::~urlencode(local_5a8);
  cppcms::filters::streamable::~streamable(&local_5c8);
  cppcms::application::response();
  cppcms::http::response::out();
  cppcms::filters::streamable::streamable<std::__cxx11::string>(&local_610,local_2b8);
  cppcms::filters::base64_urlencode::base64_urlencode(local_5f0,&local_610);
  poVar4 = cppcms::filters::operator<<
                     ((ostream *)in_stack_fffffffffffff130,
                      (base64_urlencode *)
                      CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
  std::operator<<(poVar4,"<br>\n");
  cppcms::filters::base64_urlencode::~base64_urlencode(local_5f0);
  cppcms::filters::streamable::~streamable(&local_610);
  cppcms::application::response();
  cppcms::http::response::out();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_778,"{1,datetime=f}",&local_779);
  booster::locale::basic_format<char>::basic_format
            (in_stack_fffffffffffff170,in_stack_fffffffffffff168);
  local_788 = time((time_t *)0x0);
  booster::locale::basic_format<char>::operator%
            (in_stack_fffffffffffff140,(long *)in_stack_fffffffffffff138);
  pbVar5 = booster::locale::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffff130,
                      (basic_format<char> *)
                      CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
  std::operator<<(pbVar5,"<br>\n");
  booster::locale::basic_format<char>::~basic_format(in_stack_fffffffffffff130);
  std::__cxx11::string::~string(local_778);
  std::allocator<char>::~allocator((allocator<char> *)&local_779);
  cppcms::application::response();
  cppcms::http::response::out();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8f0,"{1,datetime=f}",&local_8f1);
  booster::locale::basic_format<char>::basic_format
            (in_stack_fffffffffffff170,in_stack_fffffffffffff168);
  local_948 = time((time_t *)0x0);
  cppcms::filters::streamable::streamable<long>
            (in_stack_fffffffffffff150,(long *)in_stack_fffffffffffff148);
  cppcms::filters::escape::escape(local_920,&local_940);
  booster::locale::basic_format<char>::operator%
            (in_stack_fffffffffffff140,in_stack_fffffffffffff138);
  pbVar5 = booster::locale::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffff130,
                      (basic_format<char> *)
                      CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
  std::operator<<(pbVar5,"<br>\n");
  cppcms::filters::escape::~escape(local_920);
  cppcms::filters::streamable::~streamable(&local_940);
  booster::locale::basic_format<char>::~basic_format(in_stack_fffffffffffff130);
  std::__cxx11::string::~string(local_8f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f1);
  cppcms::application::response();
  poVar4 = (ostream *)cppcms::http::response::out();
  cppcms::application::response();
  cppcms::http::response::out();
  std::ios_base::getloc((ios_base *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
  std::use_facet<booster::locale::info>((locale *)in_stack_fffffffffffff140);
  booster::locale::info::language_abi_cxx11_
            ((info *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
  poVar4 = std::operator<<(poVar4,local_968);
  std::operator<<(poVar4,"<br>\n");
  std::__cxx11::string::~string(local_968);
  std::locale::~locale(local_970);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>
  ::_Rb_tree_const_iterator(&local_978);
  cppcms::application::request();
  cppcms::http::request::cookies_abi_cxx11_();
  local_980 = (_Base_ptr)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
              ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
                       *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
  local_978._M_node = local_980;
  while( true ) {
    cppcms::application::request();
    cppcms::http::request::cookies_abi_cxx11_();
    local_988._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
                *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
    bVar1 = std::operator!=(&local_978,&local_988);
    if (!bVar1) break;
    cppcms::application::response();
    poVar4 = (ostream *)cppcms::http::response::out();
    ppVar6 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>
                           *)in_stack_fffffffffffff130);
    poVar4 = (ostream *)cppcms::http::operator<<(poVar4,&ppVar6->second);
    std::operator<<(poVar4,"<br/>\n");
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>
                  *)in_stack_fffffffffffff130);
  }
  cppcms::application::response();
  cppcms::http::response::out();
  local_9f8 = time((time_t *)0x0);
  cppcms::filters::streamable::streamable<long>
            (in_stack_fffffffffffff150,(long *)in_stack_fffffffffffff148);
  cppcms::filters::date::date(local_9d0,&local_9f0);
  poVar4 = cppcms::filters::operator<<
                     ((ostream *)in_stack_fffffffffffff130,
                      (date *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  cppcms::filters::date::~date(local_9d0);
  cppcms::filters::streamable::~streamable(&local_9f0);
  cppcms::application::response();
  cppcms::http::response::out();
  booster::locale::translate<char>
            ((char *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
  cppcms::filters::streamable::streamable<booster::locale::basic_message<char>>
            (in_stack_fffffffffffff150,in_stack_fffffffffffff148);
  cppcms::filters::escape::escape(local_a20,&local_a40);
  this_00 = (basic_format<char> *)
            cppcms::filters::operator<<
                      ((ostream *)in_stack_fffffffffffff130,
                       (escape *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
  std::operator<<((ostream *)this_00,"<br>");
  cppcms::filters::escape::~escape(local_a20);
  cppcms::filters::streamable::~streamable(&local_a40);
  booster::locale::basic_message<char>::~basic_message(&in_stack_fffffffffffff130->message_);
  for (local_ac4 = 0; local_ac4 < 0x1e; local_ac4 = local_ac4 + 1) {
    trans = (message_type *)cppcms::application::response();
    cppcms::http::response::out();
    booster::locale::translate<char>
              ((char *)in_stack_fffffffffffff138,(char *)in_stack_fffffffffffff130,
               in_stack_fffffffffffff12c);
    booster::locale::basic_format<char>::basic_format(this_00,trans);
    booster::locale::basic_format<char>::operator%
              (in_stack_fffffffffffff140,(int *)in_stack_fffffffffffff138);
    in_stack_fffffffffffff140 =
         (basic_format<char> *)
         booster::locale::operator<<
                   ((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffff130,
                    (basic_format<char> *)
                    CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128));
    std::operator<<((ostream *)in_stack_fffffffffffff140,"<br>\n");
    booster::locale::basic_format<char>::~basic_format(in_stack_fffffffffffff130);
    booster::locale::basic_message<char>::~basic_message(&in_stack_fffffffffffff130->message_);
  }
  cppcms::application::response();
  poVar4 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar4,"<body></html>\n");
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::~string(local_2e0);
  std::__cxx11::string::~string(local_2b8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void hello_world()
	{
		using namespace cppcms;
		std::ostringstream ss;
		ss<<std::time(NULL);
		response().set_cookie(cppcms::http::cookie("test",ss.str()));
		response().out() <<
			"<html><body>\n"
			"<h1>Hello World!</h1>\n";
		std::string t1="text";
		std::string t2="text text";
		std::string t3="<text>";
		response().out()<<cppcms::filters::date(time(0)) << "<br>\n";
		response().out()<<cppcms::filters::time(time(0)) << "<br>\n";
		response().out()<<cppcms::filters::datetime(time(0)) << "<br>\n";
		response().out()<<cppcms::filters::to_upper(t1) << "<br>\n";
		response().out()<<cppcms::filters::to_lower(t1) << "<br>\n";
		response().out()<<cppcms::filters::to_title(t1) << "<br>\n";
		response().out()<<cppcms::filters::escape(t3) << "<br>\n";
		response().out()<<cppcms::filters::urlencode(t2) << "<br>\n";
		response().out()<<cppcms::filters::base64_urlencode(t1) << "<br>\n";
		response().out()<<locale::format("{1,datetime=f}") % time(0) << "<br>\n";
		response().out()<<locale::format("{1,datetime=f}") % cppcms::filters::escape(time(0)) << "<br>\n";
		response().out()<<std::use_facet<locale::info>(response().out().getloc()).language()<<"<br>\n";
		cppcms::http::request::cookies_type::const_iterator p;
		for(p=request().cookies().begin();p!=request().cookies().end();++p) {
			response().out()<<p->second<<"<br/>\n";
		}

		response().out() << filters::date(time(0)) <<std::endl;

		response().out() << filters::escape(locale::translate("hello\n")) << "<br>";
		
		for(int i=0;i<30;i++) {
			response().out() << locale::format(locale::translate("passed one day","passed {1} days",i)) % i << "<br>\n";
		}
		response().out()
			<<"<body></html>\n";

	}